

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

QString * __thiscall
QtPrivate::QStringList_join
          (QString *__return_storage_ptr__,QtPrivate *this,QStringList *list,QLatin1StringView sep)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  qsizetype alloc;
  long lVar4;
  QString *str;
  QLatin1StringView str_00;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(this + 0x10) != 0) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar4 = (long)&(list->d).d + *(long *)(*(long *)(this + 8) + 0x10 + lVar3) + lVar4;
      lVar3 = lVar3 + 0x18;
    } while (*(long *)(this + 0x10) * 0x18 != lVar3);
    alloc = 0;
    if (0 < lVar4 - (long)list) {
      alloc = lVar4 - (long)list;
    }
    QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
    pDVar2 = (__return_storage_ptr__->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    str = *(QString **)(this + 8);
    lVar4 = *(long *)(this + 0x10);
    QString::append(__return_storage_ptr__,str);
    lVar4 = lVar4 * 0x18;
    while( true ) {
      str = str + 1;
      lVar4 = lVar4 + -0x18;
      if (lVar4 == 0) break;
      str_00.m_data = (char *)sep.m_size;
      str_00.m_size = (qsizetype)list;
      QString::append(__return_storage_ptr__,str_00);
      QString::append(__return_storage_ptr__,str);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList &list, QLatin1StringView sep)
{
    QString result;
    if (!list.isEmpty()) {
        result.reserve(accumulatedSize(list, sep.size()));
        const auto end = list.end();
        auto it = list.begin();
        result += *it;
        while (++it != end) {
            result += sep;
            result += *it;
        }
    }
    return result;
}